

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::populate_initial_block_list
          (ConcurrentQueue<_zframe_t_*,_MyTraits> *this,size_t blockCount)

{
  Block *pBVar1;
  bool *pbVar2;
  size_t sVar3;
  bool bVar4;
  
  this->initialBlockPoolSize = blockCount;
  if (blockCount == 0) {
    this->initialBlockPool = (Block *)0x0;
  }
  else {
    pBVar1 = ConcurrentQueue<_zframe_t*,MyTraits>::
             create_array<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block>(blockCount);
    this->initialBlockPool = pBVar1;
    if (pBVar1 == (Block *)0x0) {
      this->initialBlockPoolSize = 0;
      sVar3 = 0;
    }
    else {
      sVar3 = this->initialBlockPoolSize;
    }
    pbVar2 = &pBVar1->dynamicallyAllocated;
    while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
      *pbVar2 = false;
      pbVar2 = pbVar2 + 0x830;
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount)
	{
		initialBlockPoolSize = blockCount;
		if (initialBlockPoolSize == 0) {
			initialBlockPool = nullptr;
			return;
		}
		
		initialBlockPool = create_array<Block>(blockCount);
		if (initialBlockPool == nullptr) {
			initialBlockPoolSize = 0;
		}
		for (size_t i = 0; i < initialBlockPoolSize; ++i) {
			initialBlockPool[i].dynamicallyAllocated = false;
		}
	}